

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AllowServerConnect(connectdata *conn,_Bool *connected)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  long lVar2;
  CURLcode local_34;
  CURLcode ret;
  long timeout_ms;
  SessionHandle *data;
  _Bool *connected_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  *connected = false;
  Curl_infof(data_00,"Preparing for accepting server on data port\n");
  Curl_pgrsTime(data_00,TIMER_STARTACCEPT);
  lVar2 = ftp_timeleft_accept(data_00);
  if (lVar2 < 0) {
    Curl_failf(data_00,"Accept timeout occurred while waiting server connect");
    conn_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    local_34 = ReceivedServerConnect(conn,connected);
    conn_local._4_4_ = local_34;
    if (local_34 == CURLE_OK) {
      if ((*connected & 1U) == 0) {
        if ((*connected & 1U) == 0) {
          if ((data_00->set).accepttimeout < 1) {
            Curl_expire(data_00,60000);
          }
          else {
            Curl_expire(data_00,(data_00->set).accepttimeout);
          }
        }
      }
      else {
        CVar1 = AcceptServerConnect(conn);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        local_34 = InitiateTransfer(conn);
        if (local_34 != CURLE_OK) {
          return local_34;
        }
      }
      conn_local._4_4_ = local_34;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode AllowServerConnect(struct connectdata *conn, bool *connected)
{
  struct SessionHandle *data = conn->data;
  long timeout_ms;
  CURLcode ret = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port\n");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* see if the connection request is already here */
  ret = ReceivedServerConnect(conn, connected);
  if(ret)
    return ret;

  if(*connected) {
    ret = AcceptServerConnect(conn);
    if(ret)
      return ret;

    ret = InitiateTransfer(conn);
    if(ret)
      return ret;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    if(ret == CURLE_OK && *connected == FALSE) {
      if(data->set.accepttimeout > 0)
        Curl_expire(data, data->set.accepttimeout);
      else
        Curl_expire(data, DEFAULT_ACCEPT_TIMEOUT);
    }
  }

  return ret;
}